

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTestSuites(UnitTest *unit_test)

{
  pointer piVar1;
  bool bVar2;
  pointer ppTVar3;
  UnitTestImpl *pUVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  TestSuite *pTVar8;
  
  pUVar4 = unit_test->impl_;
  ppTVar3 = (pUVar4->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar4->test_suites_).
                              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3) >> 3)) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      piVar1 = (pUVar4->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((lVar7 < (int)((ulong)((long)(pUVar4->test_suite_indices_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)piVar1) >> 2)) &&
         (-1 < piVar1[lVar7])) {
        pTVar8 = ppTVar3[lVar7];
      }
      else {
        pTVar8 = (TestSuite *)0x0;
      }
      if (pTVar8->should_run_ == true) {
        bVar2 = TestResult::Failed(&pTVar8->ad_hoc_test_result_);
        if (bVar2) {
          ColoredPrintf(kRed,"[  FAILED  ] ");
          printf("%s: SetUpTestSuite or TearDownTestSuite\n",(pTVar8->name_)._M_dataplus._M_p);
          uVar6 = uVar6 + 1;
        }
      }
      lVar7 = lVar7 + 1;
      pUVar4 = unit_test->impl_;
      ppTVar3 = (pUVar4->test_suites_).
                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar7 < (int)((ulong)((long)(pUVar4->test_suites_).
                                         super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3)
                          >> 3));
    if (0 < (int)uVar6) {
      pcVar5 = "SUITES";
      if (uVar6 == 1) {
        pcVar5 = "SUITE";
      }
      printf("\n%2d FAILED TEST %s\n",(ulong)uVar6,pcVar5);
      return;
    }
  }
  return;
}

Assistant:

Message& Message::operator<<(const wchar_t* wide_c_str) {
  return *this << internal::String::ShowWideCString(wide_c_str);
}